

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O3

string * verilogAST::add_tab(string *__return_storage_ptr__,string *block)

{
  char cVar1;
  long *plVar2;
  long *plVar3;
  string line;
  istringstream block_stream;
  long *local_210;
  long local_200;
  long lStack_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)block,_S_in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 2) == 0) {
    do {
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_local_buf[0] = '\0';
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) +
                              (char)(istringstream *)local_1b0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_1b0,(string *)&local_1f0,cVar1);
      std::operator+(&local_1d0,"    ",&local_1f0);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_200 = *plVar3;
        lStack_1f8 = plVar2[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *plVar3;
        local_210 = (long *)*plVar2;
      }
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_210);
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,
                        CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                 local_1f0.field_2._M_local_buf[0]) + 1);
      }
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 2) == 0);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string add_tab(std::string block) {
  // Indents each line by four spaces, adds an extra newline at the end
  std::istringstream block_stream(block);
  std::string new_block;
  while (!block_stream.eof()) {
    std::string line;
    std::getline(block_stream, line);
    new_block += "    " + line + "\n";
  }
  return new_block;
}